

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcArbitraryOpenProfileDef::~IfcArbitraryOpenProfileDef
          (IfcArbitraryOpenProfileDef *this)

{
  ~IfcArbitraryOpenProfileDef
            ((IfcArbitraryOpenProfileDef *)&this[-1].super_IfcProfileDef.ProfileName);
  return;
}

Assistant:

IfcArbitraryOpenProfileDef() : Object("IfcArbitraryOpenProfileDef") {}